

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dac_control.c
# Opt level: O0

void daccontrol_set_frequency(void *info,UINT32 Frequency)

{
  dac_control *chip;
  UINT32 Frequency_local;
  void *info_local;
  
  if ((*(byte *)((long)info + 0x7c) & 0x80) == 0) {
    *(UINT32 *)((long)info + 0x5c) = Frequency;
    RC_SET_RATIO((RATIO_CNTR *)((long)info + 0x80),*(UINT32 *)((long)info + 0x5c),
                 *(UINT32 *)((long)info + 0x58));
  }
  return;
}

Assistant:

void daccontrol_set_frequency(void* info, UINT32 Frequency)
{
	dac_control* chip = (dac_control*)info;
	
	if (chip->Running & 0x80)
		return;
	
	chip->Frequency = Frequency;
	RC_SET_RATIO(&chip->stepCntr, chip->Frequency, chip->sampleRate);
	
	return;
}